

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O2

void process(char *xmlFile)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  SchemaGrammar *this;
  ostream *poVar6;
  SchemaElementDecl *this_00;
  XMLCh *pXVar7;
  ContentSpecNode *cSpecNode;
  XMLAttDefList *attList;
  SchemaElementDecl *pSVar8;
  char *pcVar9;
  StrX local_180;
  StrX local_178;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> elemEnum;
  SAXParser parser;
  
  xercesc_4_0::SAXParser::SAXParser
            (&parser,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)&parser);
  xercesc_4_0::SAXParser::setDoNamespaces(SUB81(&parser,0));
  xercesc_4_0::SAXParser::setDoSchema(SUB81(&parser,0));
  xercesc_4_0::SAXParser::parse((char *)&parser);
  iVar4 = xercesc_4_0::SAXParser::getErrorCount();
  if (iVar4 == 0) {
    plVar5 = (long *)xercesc_4_0::SAXParser::getValidator();
    cVar3 = (**(code **)(*plVar5 + 0x68))(plVar5);
    if (cVar3 != '\0') {
      this = (SchemaGrammar *)xercesc_4_0::SAXParser::getRootGrammar();
      if (this != (SchemaGrammar *)0x0) {
        iVar4 = (**(code **)(*(long *)this + 0x28))(this);
        if (iVar4 == 1) {
          xercesc_4_0::SchemaGrammar::getElemEnumerator(&elemEnum,this);
          if ((elemEnum.fCurIndex == 0) ||
             (*(ulong *)(elemEnum.fToEnum + 0x30) < elemEnum.fCurIndex)) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "\nThe validator has no elements to display\n");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          else {
            while ((elemEnum.fCurIndex != 0 &&
                   (elemEnum.fCurIndex <= *(ulong *)(elemEnum.fToEnum + 0x30)))) {
              this_00 = xercesc_4_0::
                        RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                        ::nextElement(&elemEnum);
              poVar6 = std::operator<<((ostream *)&std::cout,"Name:\t\t\t");
              pXVar7 = xercesc_4_0::XMLElementDecl::getFullName((XMLElementDecl *)this_00);
              StrX::StrX(&local_180,pXVar7);
              std::operator<<(poVar6,local_180.fLocalForm);
              std::operator<<(poVar6,"\n");
              StrX::~StrX(&local_180);
              std::operator<<((ostream *)&std::cout,"Model Type:\t\t");
              pSVar8 = this_00 + 0x2c;
              if (*(long *)(this_00 + 0x50) != 0) {
                pSVar8 = (SchemaElementDecl *)(*(long *)(this_00 + 0x50) + 0x20);
              }
              pcVar9 = "Unknown";
              if ((ulong)*(uint *)pSVar8 < 7) {
                pcVar9 = &DAT_00107858 + *(int *)(&DAT_00107858 + (ulong)*(uint *)pSVar8 * 4);
              }
              std::operator<<((ostream *)&std::cout,pcVar9);
              std::operator<<((ostream *)&std::cout,"\n");
              std::operator<<((ostream *)&std::cout,"Create Reason:\t");
              pcVar9 = "Unknown";
              if ((ulong)*(uint *)(this_00 + 0x18) < 6) {
                pcVar9 = &DAT_00107874 +
                         *(int *)(&DAT_00107874 + (ulong)*(uint *)(this_00 + 0x18) * 4);
              }
              std::operator<<((ostream *)&std::cout,pcVar9);
              std::operator<<((ostream *)&std::cout,"\n");
              cSpecNode = (ContentSpecNode *)(**(code **)(*(long *)this_00 + 0x40))(this_00);
              processContentSpecNode(cSpecNode,false);
              uVar1 = *(uint *)(this_00 + 0x40);
              if (uVar1 != 0) {
                std::operator<<((ostream *)&std::cout,"Misc. Flags:\t");
                if ((uVar1 & 1) != 0) {
                  std::operator<<((ostream *)&std::cout,"Nillable ");
                }
                if ((uVar1 & 2) != 0) {
                  std::operator<<((ostream *)&std::cout,"Abstract ");
                }
                if ((uVar1 & 4) != 0) {
                  std::operator<<((ostream *)&std::cout,"Fixed ");
                }
                std::operator<<((ostream *)&std::cout,"\n");
              }
              lVar2 = *(long *)(this_00 + 0x70);
              if (lVar2 != 0) {
                pXVar7 = (XMLCh *)xercesc_4_0::SAXParser::getURIText((uint)&parser);
                poVar6 = std::operator<<((ostream *)&std::cout,"Substitution Name:\t");
                StrX::StrX(&local_180,pXVar7);
                std::operator<<(poVar6,local_180.fLocalForm);
                poVar6 = std::operator<<(poVar6,",");
                StrX::StrX(&local_178,*(XMLCh **)(*(long *)(lVar2 + 0x10) + 0x30));
                std::operator<<(poVar6,local_178.fLocalForm);
                std::operator<<(poVar6,"\n");
                StrX::~StrX(&local_178);
                StrX::~StrX(&local_180);
              }
              pXVar7 = (XMLCh *)(**(code **)(*(long *)this_00 + 0x68))(this_00);
              if (pXVar7 != (XMLCh *)0x0) {
                poVar6 = std::operator<<((ostream *)&std::cout,"Content Model:\t");
                StrX::StrX(&local_180,pXVar7);
                std::operator<<(poVar6,local_180.fLocalForm);
                std::operator<<(poVar6,"\n");
                StrX::~StrX(&local_180);
              }
              lVar2 = *(long *)(this_00 + 0x50);
              if (lVar2 != 0) {
                std::operator<<((ostream *)&std::cout,"ComplexType:\n");
                poVar6 = std::operator<<((ostream *)&std::cout,"\tTypeName:\t");
                StrX::StrX(&local_180,*(XMLCh **)(lVar2 + 0x30));
                std::operator<<(poVar6,local_180.fLocalForm);
                std::operator<<(poVar6,"\n");
                StrX::~StrX(&local_180);
                processContentSpecNode(*(ContentSpecNode **)(lVar2 + 0x60),true);
              }
              processDatatypeValidator(*(DatatypeValidator **)(this_00 + 0x78),false);
              cVar3 = (**(code **)(*(long *)this_00 + 0x38))(this_00);
              if (cVar3 != '\0') {
                attList = (XMLAttDefList *)(**(code **)(*(long *)this_00 + 0x28))(this_00);
                processAttributes(attList,false);
              }
              std::operator<<((ostream *)&std::cout,"--------------------------------------------");
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
          }
          xercesc_4_0::
          RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
          ~RefHash3KeysIdPoolEnumerator(&elemEnum);
          goto LAB_0010569c;
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"\n Non schema grammar, no output available\n")
      ;
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_0010569c;
    }
    pcVar9 = "\n Non schema document, no output available\n";
  }
  else {
    pcVar9 = "\nErrors occurred, no output available\n";
  }
  poVar6 = std::operator<<((ostream *)&std::cout,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_0010569c:
  xercesc_4_0::SAXParser::~SAXParser(&parser);
  return;
}

Assistant:

void process(char* const xmlFile)
{
    //
    //  Create a Schema validator to be used for our validation work. Then create
    //  a SAX parser object and pass it our validator. Then, according to what
    //  we were told on the command line, set it to validate or not. He owns
    //  the validator, so we have to allocate it.
    //
    SAXParser parser;
    parser.setValidationScheme(SAXParser::Val_Always);
    parser.setDoNamespaces(true);
    parser.setDoSchema(true);

	parser.parse(xmlFile);

    if (parser.getErrorCount())
	{
        std::cout << "\nErrors occurred, no output available\n" << std::endl;
		return;
	}

	if (!parser.getValidator().handlesSchema())
	{
		std::cout << "\n Non schema document, no output available\n" << std::endl;
		return;
	}

	Grammar* rootGrammar = parser.getRootGrammar();
	if (!rootGrammar || rootGrammar->getGrammarType() != Grammar::SchemaGrammarType)
	{
		std::cout << "\n Non schema grammar, no output available\n" << std::endl;
		return;
	}

	//
	//  Now we will get an enumerator for the element pool from the validator
	//  and enumerate the elements, printing them as we go. For each element
	//  we get an enumerator for its attributes and print them also.
	//

	SchemaGrammar* grammar = (SchemaGrammar*) rootGrammar;
	RefHash3KeysIdPoolEnumerator<SchemaElementDecl> elemEnum = grammar->getElemEnumerator();

	if (!elemEnum.hasMoreElements())
	{
		std::cout << "\nThe validator has no elements to display\n" << std::endl;
		return;
	}

	while(elemEnum.hasMoreElements())
	{
		const SchemaElementDecl& curElem = elemEnum.nextElement();

		// Name
		std::cout << "Name:\t\t\t" << StrX(curElem.getFullName()) << "\n";

		// Model Type
		std::cout << "Model Type:\t\t";
		switch( curElem.getModelType() )
		{
		case SchemaElementDecl::Empty:          std::cout << "Empty";         break;
		case SchemaElementDecl::Any:            std::cout << "Any";           break;
		case SchemaElementDecl::Mixed_Simple:   std::cout << "Mixed_Simple";  break;
		case SchemaElementDecl::Mixed_Complex:  std::cout << "Mixed_Complex"; break;
		case SchemaElementDecl::Children:       std::cout << "Children";      break;
		case SchemaElementDecl::Simple:         std::cout << "Simple";        break;
        case SchemaElementDecl::ElementOnlyEmpty:    std::cout << "ElementOnlyEmpty";    break;

		default:                                std::cout << "Unknown";       break;
		}

		std::cout << "\n";

		// Create Reason
		std::cout << "Create Reason:\t";
		switch( curElem.getCreateReason() )
		{
		case XMLElementDecl::NoReason:          std::cout << "Empty";            break;
		case XMLElementDecl::Declared:          std::cout << "Declared";         break;
		case XMLElementDecl::AttList:           std::cout << "AttList";          break;
		case XMLElementDecl::InContentModel:    std::cout << "InContentModel";   break;
		case XMLElementDecl::AsRootElem:        std::cout << "AsRootElem";       break;
		case XMLElementDecl::JustFaultIn:       std::cout << "JustFaultIn";      break;

		default:                            std::cout << "Unknown";  break;
		}

		std::cout << "\n";

		// Content Spec Node
		processContentSpecNode( curElem.getContentSpec() );

		// Misc Flags
		int mflags = curElem.getMiscFlags();
		if( mflags !=0 )
		{
			std::cout << "Misc. Flags:\t";
		}

        if ( mflags & SchemaSymbols::XSD_NILLABLE )
			std::cout << "Nillable ";

		if ( mflags & SchemaSymbols::XSD_ABSTRACT )
			std::cout << "Abstract ";

		if ( mflags & SchemaSymbols::XSD_FIXED )
			std::cout << "Fixed ";

		if( mflags !=0 )
		{
			std::cout << "\n";
		}

		// Substitution Name
		SchemaElementDecl* subsGroup = curElem.getSubstitutionGroupElem();
		if( subsGroup )
		{
			const XMLCh* uriText = parser.getURIText(subsGroup->getURI());
			std::cout << "Substitution Name:\t" << StrX(uriText)
			     << "," << StrX(subsGroup->getBaseName()) << "\n";
		}

		// Content Model
		const XMLCh* fmtCntModel = curElem.getFormattedContentModel();
		if( fmtCntModel != NULL )
		{
			std::cout << "Content Model:\t" << StrX(fmtCntModel) << "\n";
		}

		const ComplexTypeInfo* ctype = curElem.getComplexTypeInfo();
		if( ctype != NULL)
		{
			std::cout << "ComplexType:\n";
			std::cout << "\tTypeName:\t" << StrX(ctype->getTypeName()) << "\n";

			ContentSpecNode* cSpecNode = ctype->getContentSpec();
			processContentSpecNode(cSpecNode, true );
		}

		// Datatype
		DatatypeValidator* dtValidator = curElem.getDatatypeValidator();
		processDatatypeValidator( dtValidator );

		// Get an enumerator for this guy's attributes if any
		if ( curElem.hasAttDefs() )
		{
			processAttributes( curElem.getAttDefList() );
		}

		std::cout << "--------------------------------------------";
		std::cout << std::endl;

    }

    return;
}